

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Settings.cpp
# Opt level: O2

Address * __thiscall Settings::getProxyAddr(Settings *this,String *destination_)

{
  DestinationHttpProxyAddrsMap *this_00;
  Item *pIVar1;
  Iterator IVar2;
  Address *pAVar3;
  char *pcVar4;
  char *pcVar5;
  Address *local_90;
  String destination;
  String local_58;
  
  this_00 = &this->_destinationHttpProxyAddrs;
  IVar2 = HashMap<String,_Array<Address>_>::find(this_00,destination_);
  if (IVar2.item != (this->_destinationHttpProxyAddrs)._end.item) {
    pAVar3 = anon_unknown.dwarf_100ce::getRandomProxyAddr(&(IVar2.item)->value);
    return pAVar3;
  }
  pcVar4 = String::find(destination_,'.');
  if (pcVar4 != (char *)0x0) {
    pcVar5 = String::operator_cast_to_char_(destination_);
    String::substr(&destination,destination_,(ssize)(pcVar4 + (1 - (long)pcVar5)),-1);
    while( true ) {
      IVar2 = HashMap<String,_Array<Address>_>::find(this_00,&destination);
      pIVar1 = (this_00->_end).item;
      if (IVar2.item != pIVar1) break;
      pcVar4 = String::find(&destination,'.');
      if (pcVar4 == (char *)0x0) goto LAB_00108c47;
      pcVar5 = String::operator_cast_to_char_(&destination);
      String::substr(&local_58,&destination,(ssize)(pcVar4 + (1 - (long)pcVar5)),-1);
      String::operator=(&destination,&local_58);
      String::~String(&local_58);
    }
    local_90 = anon_unknown.dwarf_100ce::getRandomProxyAddr(&(IVar2.item)->value);
LAB_00108c47:
    String::~String(&destination);
    if (IVar2.item != pIVar1) {
      return local_90;
    }
  }
  pAVar3 = anon_unknown.dwarf_100ce::getRandomProxyAddr(&this->_httpProxyAddrs);
  return pAVar3;
}

Assistant:

const Address& Settings::getProxyAddr(const String& destination_)
{
    DestinationHttpProxyAddrsMap::Iterator it = _destinationHttpProxyAddrs.find(destination_);
    if (it != _destinationHttpProxyAddrs.end())
        return getRandomProxyAddr(*it);
    if (const char* x = destination_.find('.'))
    {
        String destination = destination_.substr(x - (const char*)destination_ + 1);
        for (;;)
        {
            it = _destinationHttpProxyAddrs.find(destination);
            if (it != _destinationHttpProxyAddrs.end())
                return getRandomProxyAddr(*it);
            const char* x = destination.find('.');
            if (!x)
                break;
            destination = destination.substr(x - (const char*)destination + 1);
        }
    }
    return getRandomProxyAddr(_httpProxyAddrs);
}